

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

int __thiscall despot::VNode::PolicyTreeSize(VNode *this)

{
  QNode *this_00;
  size_type sVar1;
  const_reference ppQVar2;
  double dVar3;
  double dVar4;
  QNode *child;
  QNode *pQStack_20;
  int a;
  QNode *best;
  VNode *this_local;
  
  sVar1 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::size(&this->children_);
  if (sVar1 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    pQStack_20 = (QNode *)0x0;
    child._4_4_ = 0;
    while( true ) {
      sVar1 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::size(&this->children_)
      ;
      if (sVar1 <= (ulong)(long)child._4_4_) break;
      ppQVar2 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::operator[]
                          (&this->children_,(long)child._4_4_);
      this_00 = *ppQVar2;
      if (pQStack_20 == (QNode *)0x0) {
LAB_001ca633:
        pQStack_20 = this_00;
      }
      else {
        dVar3 = QNode::lower_bound(this_00);
        dVar4 = QNode::lower_bound(pQStack_20);
        if (dVar4 < dVar3) goto LAB_001ca633;
      }
      child._4_4_ = child._4_4_ + 1;
    }
    this_local._4_4_ = QNode::PolicyTreeSize(pQStack_20);
  }
  return this_local._4_4_;
}

Assistant:

int VNode::PolicyTreeSize() const {
	if (children_.size() == 0)
		return 0;

	QNode* best = NULL;
	for (int a = 0; a < children_.size(); a++) {
		QNode* child = children_[a];
		if (best == NULL || child->lower_bound() > best->lower_bound())
			best = child;
	}
	return best->PolicyTreeSize();
}